

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_sense(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_sense_entry *peVar1;
  uint uVar2;
  envy_bios_power_sense *peVar3;
  envy_bios_power_sense_entry *e;
  int i;
  envy_bios_power_sense *sense;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar3 = &(bios->power).sense;
  if ((peVar3->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).sense.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse SENSE table at 0x%x, version %x\n",(ulong)peVar3->offset,
              (ulong)(bios->power).sense.version);
    }
    else {
      fprintf((FILE *)out,"SENSE table at 0x%x, version %x\n",(ulong)peVar3->offset,
              (ulong)(bios->power).sense.version);
      envy_bios_dump_hex(bios,out,peVar3->offset,(uint)(bios->power).sense.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (e._4_4_ = 0; (int)e._4_4_ < (int)(uint)(bios->power).sense.entriesnum;
          e._4_4_ = e._4_4_ + 1) {
        peVar1 = (bios->power).sense.entries;
        if (peVar1[(int)e._4_4_].extdev_id < (bios->extdev).entriesnum) {
          uVar2 = (uint)(bios->extdev).entries[peVar1[(int)e._4_4_].extdev_id].type;
          if (uVar2 - 0x4c < 2) {
            fprintf((FILE *)out,
                    "power rail %i: unk0 = 0x%x, extdev_id = %u, shunt resistor = %u mOhm (unk %x), config = 0x%04x\n"
                    ,(ulong)e._4_4_,(ulong)peVar1[(int)e._4_4_].mode,
                    (ulong)peVar1[(int)e._4_4_].extdev_id,
                    (ulong)peVar1[(int)e._4_4_].d.ina219.res.mohm,
                    (uint)peVar1[(int)e._4_4_].d.ina219.res.unk,
                    (uint)peVar1[(int)e._4_4_].d.ina219.config);
          }
          else if (uVar2 == 0x4e) {
            fprintf((FILE *)out,
                    "power rail %i: unk0 = 0x%x, extdev_id = %u, shunt resistors = {%u mOhm (unk %x), %u mOhm (unk %x), %u mOhm (unk %x)}, config = 0x%04x\n"
                    ,(ulong)e._4_4_,(ulong)peVar1[(int)e._4_4_].mode,
                    (ulong)peVar1[(int)e._4_4_].extdev_id,
                    (ulong)peVar1[(int)e._4_4_].d.ina219.res.mohm,
                    (uint)peVar1[(int)e._4_4_].d.ina219.res.unk,
                    (uint)peVar1[(int)e._4_4_].d.ina3221.res[1].mohm,
                    (uint)peVar1[(int)e._4_4_].d.ina3221.res[1].unk,
                    (uint)peVar1[(int)e._4_4_].d.ina3221.res[2].mohm,
                    (uint)peVar1[(int)e._4_4_].d.ina3221.res[2].unk,
                    (uint)peVar1[(int)e._4_4_].d.ina3221.config);
          }
          else {
            fprintf((FILE *)out,"power rail %i: unk0 = 0x%x, extdev_id = %u\n",(ulong)e._4_4_,
                    (ulong)peVar1[(int)e._4_4_].mode,(ulong)peVar1[(int)e._4_4_].extdev_id);
          }
        }
        envy_bios_dump_hex(bios,out,(bios->power).sense.entries[(int)e._4_4_].offset,
                           (uint)(bios->power).sense.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_sense(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_sense *sense = &bios->power.sense;
	int i;

	if (!sense->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!sense->valid) {
		fprintf(out, "Failed to parse SENSE table at 0x%x, version %x\n", sense->offset, sense->version);
		return;
	}

	fprintf(out, "SENSE table at 0x%x, version %x\n", sense->offset, sense->version);
	envy_bios_dump_hex(bios, out, sense->offset, sense->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < sense->entriesnum; i++) {
		struct envy_bios_power_sense_entry *e = &sense->entries[i];

		if (bios->extdev.entriesnum > e->extdev_id) {
			switch (bios->extdev.entries[e->extdev_id].type) {
			case ENVY_BIOS_EXTDEV_INA209:
			case ENVY_BIOS_EXTDEV_INA219:
				fprintf(out, "power rail %i: unk0 = 0x%x, extdev_id = %u, shunt resistor = %u mOhm (unk %x), config = 0x%04x\n",
					i, e->mode, e->extdev_id, e->d.ina219.res.mohm, e->d.ina219.res.unk, e->d.ina219.config);
				break;
			case ENVY_BIOS_EXTDEV_INA3221:
				fprintf(out, "power rail %i: unk0 = 0x%x, extdev_id = %u, shunt resistors = {%u mOhm (unk %x), %u mOhm (unk %x), %u mOhm (unk %x)}, config = 0x%04x\n",
					i, e->mode, e->extdev_id, e->d.ina3221.res[0].mohm, e->d.ina3221.res[0].unk, e->d.ina3221.res[1].mohm, e->d.ina3221.res[1].unk, e->d.ina3221.res[2].mohm, e->d.ina3221.res[2].unk, e->d.ina3221.config);
				break;
			default:
				fprintf(out, "power rail %i: unk0 = 0x%x, extdev_id = %u\n",
					i, e->mode, e->extdev_id);
			}
		}
		envy_bios_dump_hex(bios, out, sense->entries[i].offset, sense->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}